

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O3

int LzmaDec_DecodeReal2(CLzmaDec *p,SizeT limit,Byte *bufLimit)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  uint uVar6;
  CLzmaProb *pCVar7;
  Byte *pBVar8;
  SizeT SVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  CLzmaProb *pCVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ushort *puVar18;
  SizeT SVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  byte bVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  Byte *pBVar27;
  uint uVar28;
  uint uVar29;
  byte *pbVar30;
  long lVar31;
  UInt32 UVar32;
  short sVar33;
  SizeT SVar34;
  ulong uVar35;
  UInt32 UVar36;
  bool bVar37;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  uint local_94;
  ulong local_80;
  
  UVar36 = p->processedPos;
  uVar6 = p->checkDicSize;
  if (uVar6 == 0) {
    uVar35 = (ulong)((p->prop).dicSize - UVar36);
    SVar34 = p->dicPos;
    local_80 = limit;
    if (uVar35 < limit - SVar34) {
      local_80 = uVar35 + SVar34;
    }
  }
  else {
    SVar34 = p->dicPos;
    local_80 = limit;
  }
  pCVar7 = p->probs_1664;
  UVar32 = p->state;
  local_c0 = p->reps[0];
  local_bc = p->reps[1];
  local_c4 = p->reps[2];
  local_94 = p->reps[3];
  bVar1 = (p->prop).lp;
  bVar2 = (p->prop).pb;
  bVar3 = (p->prop).lc;
  pBVar8 = p->dic;
  SVar9 = p->dicBufSize;
  pbVar30 = p->buf;
  uVar22 = p->range;
  uVar10 = p->code;
  uVar21 = 0;
  do {
    uVar25 = local_94;
    if (uVar22 < 0x1000000) {
      uVar22 = uVar22 << 8;
      bVar23 = *pbVar30;
      pbVar30 = pbVar30 + 1;
      uVar10 = (uint)bVar23 | uVar10 << 8;
    }
    uVar11 = (UVar36 & ~(-1 << (bVar2 & 0x1f))) * 0x10;
    uVar35 = (ulong)(UVar32 + uVar11);
    uVar5 = pCVar7[uVar35 - 0x100];
    uVar28 = (uVar22 >> 0xb) * (uint)uVar5;
    uVar24 = uVar10 - uVar28;
    if (uVar10 < uVar28) {
      pCVar7[uVar35 - 0x100] = (short)(0x800 - uVar5 >> 5) + uVar5;
      pCVar14 = pCVar7 + 0x140;
      if (UVar36 != 0 || uVar6 != 0) {
        uVar35 = SVar34;
        if (SVar34 == 0) {
          uVar35 = SVar9;
        }
        pCVar14 = pCVar7 + 0x140 +
                  ((((uint)pBVar8[uVar35 - 1] | UVar36 << 8) &
                   (0x100 << (bVar1 & 0x1f)) - (0x100U >> (bVar3 & 0x1f))) << (bVar3 & 0x1f)) * 3;
      }
      if (UVar32 < 7) {
        bVar37 = UVar32 < 3;
        UVar32 = UVar32 - 3;
        if (bVar37) {
          UVar32 = 0;
        }
        if (uVar28 < 0x1000000) {
          uVar28 = uVar28 * 0x100;
          bVar23 = *pbVar30;
          pbVar30 = pbVar30 + 1;
          uVar10 = (uint)bVar23 | uVar10 << 8;
        }
        uVar5 = pCVar14[1];
        uVar25 = (uVar28 >> 0xb) * (uint)uVar5;
        uVar22 = uVar10 - uVar25;
        if (uVar10 < uVar25) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar24 = 2;
          uVar22 = uVar10;
        }
        else {
          uVar25 = uVar28 - uVar25;
          sVar33 = -(uVar5 >> 5);
          uVar24 = 3;
        }
        pCVar14[1] = sVar33 + uVar5;
        if (uVar25 < 0x1000000) {
          uVar25 = uVar25 << 8;
          bVar23 = *pbVar30;
          pbVar30 = pbVar30 + 1;
          uVar22 = (uint)bVar23 | uVar22 << 8;
        }
        uVar5 = pCVar14[uVar24];
        uVar28 = (uVar25 >> 0xb) * (uint)uVar5;
        uVar10 = uVar24 * 2;
        uVar11 = uVar22 - uVar28;
        if (uVar22 < uVar28) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar11 = uVar22;
        }
        else {
          uVar28 = uVar25 - uVar28;
          sVar33 = -(uVar5 >> 5);
          uVar10 = uVar10 | 1;
        }
        pCVar14[uVar24] = sVar33 + uVar5;
        uVar5 = pCVar14[uVar10];
        if (uVar28 < 0x1000000) {
          uVar28 = uVar28 << 8;
          bVar23 = *pbVar30;
          pbVar30 = pbVar30 + 1;
          uVar11 = (uint)bVar23 | uVar11 << 8;
        }
        uVar24 = (uVar28 >> 0xb) * (uint)uVar5;
        uVar22 = uVar10 * 2;
        uVar25 = uVar11 - uVar24;
        if (uVar11 < uVar24) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar25 = uVar11;
        }
        else {
          uVar24 = uVar28 - uVar24;
          sVar33 = -(uVar5 >> 5);
          uVar22 = uVar22 | 1;
        }
        pCVar14[uVar10] = sVar33 + uVar5;
        uVar5 = pCVar14[uVar22];
        if (uVar24 < 0x1000000) {
          uVar24 = uVar24 << 8;
          bVar23 = *pbVar30;
          pbVar30 = pbVar30 + 1;
          uVar25 = (uint)bVar23 | uVar25 << 8;
        }
        uVar28 = (uVar24 >> 0xb) * (uint)uVar5;
        uVar10 = uVar22 * 2;
        uVar11 = uVar25 - uVar28;
        if (uVar25 < uVar28) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar11 = uVar25;
        }
        else {
          uVar28 = uVar24 - uVar28;
          sVar33 = -(uVar5 >> 5);
          uVar10 = uVar10 | 1;
        }
        pCVar14[uVar22] = sVar33 + uVar5;
        uVar5 = pCVar14[uVar10];
        if (uVar28 < 0x1000000) {
          uVar28 = uVar28 << 8;
          bVar23 = *pbVar30;
          pbVar30 = pbVar30 + 1;
          uVar11 = (uint)bVar23 | uVar11 << 8;
        }
        uVar24 = (uVar28 >> 0xb) * (uint)uVar5;
        uVar22 = uVar10 * 2;
        uVar25 = uVar11 - uVar24;
        if (uVar11 < uVar24) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar25 = uVar11;
        }
        else {
          uVar24 = uVar28 - uVar24;
          sVar33 = -(uVar5 >> 5);
          uVar22 = uVar22 | 1;
        }
        pCVar14[uVar10] = sVar33 + uVar5;
        uVar5 = pCVar14[uVar22];
        if (uVar24 < 0x1000000) {
          uVar24 = uVar24 << 8;
          bVar23 = *pbVar30;
          pbVar30 = pbVar30 + 1;
          uVar25 = (uint)bVar23 | uVar25 << 8;
        }
        uVar28 = (uVar24 >> 0xb) * (uint)uVar5;
        uVar10 = uVar22 * 2;
        uVar11 = uVar25 - uVar28;
        if (uVar25 < uVar28) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar11 = uVar25;
        }
        else {
          uVar28 = uVar24 - uVar28;
          sVar33 = -(uVar5 >> 5);
          uVar10 = uVar10 | 1;
        }
        pCVar14[uVar22] = sVar33 + uVar5;
        uVar5 = pCVar14[uVar10];
        if (uVar28 < 0x1000000) {
          uVar28 = uVar28 << 8;
          bVar23 = *pbVar30;
          pbVar30 = pbVar30 + 1;
          uVar11 = (uint)bVar23 | uVar11 << 8;
        }
        uVar17 = (uVar28 >> 0xb) * (uint)uVar5;
        uVar25 = uVar10 * 2;
        uVar24 = uVar11 - uVar17;
        if (uVar11 < uVar17) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar24 = uVar11;
        }
        else {
          uVar17 = uVar28 - uVar17;
          sVar33 = -(uVar5 >> 5);
          uVar25 = uVar25 | 1;
        }
        pCVar14[uVar10] = sVar33 + uVar5;
        uVar5 = pCVar14[uVar25];
        if (uVar17 < 0x1000000) {
          uVar17 = uVar17 << 8;
          bVar23 = *pbVar30;
          pbVar30 = pbVar30 + 1;
          uVar24 = (uint)bVar23 | uVar24 << 8;
        }
        uVar22 = (uVar17 >> 0xb) * (uint)uVar5;
        bVar23 = (char)uVar25 * '\x02';
        uVar10 = uVar24 - uVar22;
        if (uVar24 < uVar22) {
          pCVar14[uVar25] = (short)(0x800 - uVar5 >> 5) + uVar5;
          uVar10 = uVar24;
        }
        else {
          uVar22 = uVar17 - uVar22;
          pCVar14[uVar25] = uVar5 - (uVar5 >> 5);
          bVar23 = bVar23 | 1;
        }
      }
      else {
        SVar19 = 0;
        if (SVar34 < local_c0) {
          SVar19 = SVar9;
        }
        if (uVar28 < 0x1000000) {
          uVar28 = uVar28 * 0x100;
          bVar23 = *pbVar30;
          pbVar30 = pbVar30 + 1;
          uVar10 = (uint)bVar23 | uVar10 << 8;
        }
        bVar23 = pBVar8[SVar19 + (SVar34 - local_c0)];
        uVar11 = (uint)bVar23;
        uVar24 = (uint)bVar23 + (uint)bVar23 & 0x100;
        uVar5 = pCVar14[(ulong)uVar24 + 0x101];
        uVar25 = (uVar28 >> 0xb) * (uint)uVar5;
        uVar22 = uVar10 - uVar25;
        if (uVar10 < uVar25) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          iVar13 = 2;
          uVar22 = uVar10;
          uVar10 = uVar24 ^ 0x100;
        }
        else {
          uVar25 = uVar28 - uVar25;
          sVar33 = -(uVar5 >> 5);
          iVar13 = 3;
          uVar10 = uVar24;
        }
        pCVar14[(ulong)uVar24 + 0x101] = sVar33 + uVar5;
        if (uVar25 < 0x1000000) {
          uVar25 = uVar25 << 8;
          bVar4 = *pbVar30;
          pbVar30 = pbVar30 + 1;
          uVar22 = (uint)bVar4 | uVar22 << 8;
        }
        uVar29 = (uint)bVar23 * 4 & uVar10;
        uVar20 = uVar10 + iVar13 + uVar29;
        uVar5 = pCVar14[uVar20];
        uVar17 = (uVar25 >> 0xb) * (uint)uVar5;
        uVar24 = iVar13 * 2;
        uVar28 = uVar22 - uVar17;
        if (uVar22 < uVar17) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar29 = uVar29 ^ uVar10;
          uVar28 = uVar22;
        }
        else {
          uVar17 = uVar25 - uVar17;
          sVar33 = -(uVar5 >> 5);
          uVar24 = uVar24 | 1;
        }
        pCVar14[uVar20] = sVar33 + uVar5;
        uVar22 = (uint)bVar23 * 8 & uVar29;
        uVar10 = uVar29 + uVar24 + uVar22;
        uVar5 = pCVar14[uVar10];
        if (uVar17 < 0x1000000) {
          uVar17 = uVar17 << 8;
          bVar4 = *pbVar30;
          pbVar30 = pbVar30 + 1;
          uVar28 = (uint)bVar4 | uVar28 << 8;
        }
        uVar20 = (uVar17 >> 0xb) * (uint)uVar5;
        uVar24 = uVar24 * 2;
        uVar25 = uVar28 - uVar20;
        if (uVar28 < uVar20) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar22 = uVar22 ^ uVar29;
          uVar25 = uVar28;
        }
        else {
          uVar20 = uVar17 - uVar20;
          sVar33 = -(uVar5 >> 5);
          uVar24 = uVar24 | 1;
        }
        pCVar14[uVar10] = sVar33 + uVar5;
        uVar28 = uVar11 << 4 & uVar22;
        uVar10 = uVar22 + uVar24 + uVar28;
        uVar5 = pCVar14[uVar10];
        if (uVar20 < 0x1000000) {
          uVar20 = uVar20 << 8;
          bVar4 = *pbVar30;
          pbVar30 = pbVar30 + 1;
          uVar25 = (uint)bVar4 | uVar25 << 8;
        }
        uVar29 = (uVar20 >> 0xb) * (uint)uVar5;
        uVar24 = uVar24 * 2;
        uVar17 = uVar25 - uVar29;
        if (uVar25 < uVar29) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar28 = uVar28 ^ uVar22;
          uVar17 = uVar25;
        }
        else {
          uVar29 = uVar20 - uVar29;
          sVar33 = -(uVar5 >> 5);
          uVar24 = uVar24 | 1;
        }
        pCVar14[uVar10] = sVar33 + uVar5;
        uVar10 = (uint)bVar23 << 5 & uVar28;
        uVar22 = uVar28 + uVar24 + uVar10;
        uVar5 = pCVar14[uVar22];
        if (uVar29 < 0x1000000) {
          uVar29 = uVar29 << 8;
          bVar23 = *pbVar30;
          pbVar30 = pbVar30 + 1;
          uVar17 = (uint)bVar23 | uVar17 << 8;
        }
        uVar20 = (uVar29 >> 0xb) * (uint)uVar5;
        uVar24 = uVar24 * 2;
        uVar25 = uVar17 - uVar20;
        if (uVar17 < uVar20) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar10 = uVar10 ^ uVar28;
          uVar25 = uVar17;
        }
        else {
          uVar20 = uVar29 - uVar20;
          sVar33 = -(uVar5 >> 5);
          uVar24 = uVar24 | 1;
        }
        pCVar14[uVar22] = sVar33 + uVar5;
        uVar22 = uVar11 << 6 & uVar10;
        uVar28 = uVar10 + uVar24 + uVar22;
        uVar5 = pCVar14[uVar28];
        if (uVar20 < 0x1000000) {
          uVar20 = uVar20 << 8;
          bVar23 = *pbVar30;
          pbVar30 = pbVar30 + 1;
          uVar25 = (uint)bVar23 | uVar25 << 8;
        }
        uVar29 = (uVar20 >> 0xb) * (uint)uVar5;
        uVar24 = uVar24 * 2;
        uVar17 = uVar25 - uVar29;
        if (uVar25 < uVar29) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar22 = uVar22 ^ uVar10;
          uVar17 = uVar25;
        }
        else {
          uVar29 = uVar20 - uVar29;
          sVar33 = -(uVar5 >> 5);
          uVar24 = uVar24 | 1;
        }
        pCVar14[uVar28] = sVar33 + uVar5;
        uVar25 = uVar11 << 7 & uVar22;
        uVar10 = uVar24 + uVar22 + uVar25;
        uVar5 = pCVar14[uVar10];
        if (uVar29 < 0x1000000) {
          uVar29 = uVar29 << 8;
          bVar23 = *pbVar30;
          pbVar30 = pbVar30 + 1;
          uVar17 = (uint)bVar23 | uVar17 << 8;
        }
        uVar20 = (uVar29 >> 0xb) * (uint)uVar5;
        uVar24 = uVar24 * 2;
        uVar28 = uVar17 - uVar20;
        if (uVar17 < uVar20) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar25 = uVar25 ^ uVar22;
          uVar28 = uVar17;
        }
        else {
          uVar20 = uVar29 - uVar20;
          sVar33 = -(uVar5 >> 5);
          uVar24 = uVar24 | 1;
        }
        pCVar14[uVar10] = sVar33 + uVar5;
        uVar25 = uVar25 + uVar24 + (uVar11 << 8 & uVar25);
        uVar5 = pCVar14[uVar25];
        if (uVar20 < 0x1000000) {
          uVar20 = uVar20 << 8;
          bVar23 = *pbVar30;
          pbVar30 = pbVar30 + 1;
          uVar28 = (uint)bVar23 | uVar28 << 8;
        }
        UVar32 = (UVar32 + (uint)(UVar32 < 10) * 3) - 6;
        uVar22 = (uVar20 >> 0xb) * (uint)uVar5;
        bVar23 = (char)uVar24 * '\x02';
        uVar10 = uVar28 - uVar22;
        if (uVar28 < uVar22) {
          pCVar14[uVar25] = (short)(0x800 - uVar5 >> 5) + uVar5;
          uVar10 = uVar28;
        }
        else {
          uVar22 = uVar20 - uVar22;
          pCVar14[uVar25] = uVar5 - (uVar5 >> 5);
          bVar23 = bVar23 | 1;
        }
      }
      pBVar8[SVar34] = bVar23;
LAB_001986fc:
      uVar35 = SVar34 + 1;
      uVar15 = 1;
    }
    else {
      uVar22 = uVar22 - uVar28;
      pCVar7[uVar35 - 0x100] = uVar5 - (uVar5 >> 5);
      if (uVar22 < 0x1000000) {
        uVar22 = uVar22 * 0x100;
        bVar23 = *pbVar30;
        pbVar30 = pbVar30 + 1;
        uVar24 = uVar24 * 0x100 | (uint)bVar23;
      }
      uVar5 = pCVar7[(ulong)UVar32 + 0x10];
      uVar28 = (uVar22 >> 0xb) * (uint)uVar5;
      uVar10 = uVar24 - uVar28;
      if (uVar24 < uVar28) {
        pCVar7[(ulong)UVar32 + 0x10] = (short)(0x800 - uVar5 >> 5) + uVar5;
        UVar32 = UVar32 + 0xc;
        puVar18 = pCVar7 + -0x300;
      }
      else {
        uVar22 = uVar22 - uVar28;
        pCVar7[(ulong)UVar32 + 0x10] = uVar5 - (uVar5 >> 5);
        if (uVar22 < 0x1000000) {
          uVar22 = uVar22 * 0x100;
          bVar23 = *pbVar30;
          pbVar30 = pbVar30 + 1;
          uVar10 = (uint)bVar23 | uVar10 * 0x100;
        }
        uVar5 = pCVar7[(ulong)UVar32 + 0x1c];
        uVar28 = (uVar22 >> 0xb) * (uint)uVar5;
        uVar24 = uVar10 - uVar28;
        if (uVar10 < uVar28) {
          pCVar7[(ulong)UVar32 + 0x1c] = (short)(0x800 - uVar5 >> 5) + uVar5;
          if (uVar28 < 0x1000000) {
            uVar28 = uVar28 * 0x100;
            bVar23 = *pbVar30;
            pbVar30 = pbVar30 + 1;
            uVar10 = (uint)bVar23 | uVar10 << 8;
          }
          uVar5 = pCVar7[uVar35 - 0x600];
          uVar22 = (uVar28 >> 0xb) * (uint)uVar5;
          uVar24 = uVar10 - uVar22;
          if (uVar10 < uVar22) {
            pCVar7[uVar35 - 0x600] = (short)(0x800 - uVar5 >> 5) + uVar5;
            SVar19 = 0;
            if (SVar34 < local_c0) {
              SVar19 = SVar9;
            }
            pBVar8[SVar34] = pBVar8[SVar19 + (SVar34 - local_c0)];
            UVar32 = (uint)(6 < UVar32) * 2 + 9;
            goto LAB_001986fc;
          }
          uVar28 = uVar28 - uVar22;
          pCVar7[uVar35 - 0x600] = uVar5 - (uVar5 >> 5);
          uVar22 = local_bc;
        }
        else {
          uVar22 = uVar22 - uVar28;
          pCVar7[(ulong)UVar32 + 0x1c] = uVar5 - (uVar5 >> 5);
          if (uVar22 < 0x1000000) {
            uVar22 = uVar22 * 0x100;
            bVar23 = *pbVar30;
            pbVar30 = pbVar30 + 1;
            uVar24 = uVar24 * 0x100 | (uint)bVar23;
          }
          uVar5 = pCVar7[(ulong)UVar32 + 0x28];
          uVar28 = (uVar22 >> 0xb) * (uint)uVar5;
          uVar10 = uVar24 - uVar28;
          if (uVar24 < uVar28) {
            pCVar7[(ulong)UVar32 + 0x28] = (short)(0x800 - uVar5 >> 5) + uVar5;
            uVar22 = local_c0;
            local_c0 = local_bc;
          }
          else {
            uVar22 = uVar22 - uVar28;
            pCVar7[(ulong)UVar32 + 0x28] = uVar5 - (uVar5 >> 5);
            if (uVar22 < 0x1000000) {
              uVar22 = uVar22 * 0x100;
              bVar23 = *pbVar30;
              pbVar30 = pbVar30 + 1;
              uVar10 = uVar10 * 0x100 | (uint)bVar23;
            }
            uVar5 = pCVar7[(ulong)UVar32 + 0x34];
            uVar28 = (uVar22 >> 0xb) * (uint)uVar5;
            uVar24 = uVar10 - uVar28;
            if (uVar10 < uVar28) {
              sVar33 = (short)(0x800 - uVar5 >> 5);
              uVar24 = uVar10;
              uVar25 = local_c4;
            }
            else {
              uVar28 = uVar22 - uVar28;
              sVar33 = -(uVar5 >> 5);
              local_94 = local_c4;
            }
            pCVar7[(ulong)UVar32 + 0x34] = sVar33 + uVar5;
            uVar22 = local_c0;
            local_c0 = uVar25;
            local_c4 = local_bc;
          }
        }
        local_bc = uVar22;
        UVar32 = (uint)(6 < UVar32) * 3 + 8;
        puVar18 = pCVar7 + -0x500;
      }
      uVar5 = *puVar18;
      if (uVar28 < 0x1000000) {
        uVar28 = uVar28 << 8;
        bVar23 = *pbVar30;
        pbVar30 = pbVar30 + 1;
        uVar24 = uVar24 << 8 | (uint)bVar23;
      }
      uVar22 = (uVar28 >> 0xb) * (uint)uVar5;
      uVar21 = uVar24 - uVar22;
      if (uVar24 < uVar22) {
        *puVar18 = (short)(0x800 - uVar5 >> 5) + uVar5;
        if (uVar22 < 0x1000000) {
          uVar22 = uVar22 * 0x100;
          bVar23 = *pbVar30;
          pbVar30 = pbVar30 + 1;
          uVar24 = uVar24 << 8 | (uint)bVar23;
        }
        uVar5 = puVar18[(ulong)uVar11 + 1];
        uVar21 = (uVar22 >> 0xb) * (uint)uVar5;
        uVar10 = uVar24 - uVar21;
        if (uVar24 < uVar21) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          lVar31 = 2;
          uVar10 = uVar24;
        }
        else {
          uVar21 = uVar22 - uVar21;
          sVar33 = -(uVar5 >> 5);
          lVar31 = 3;
        }
        puVar18[(ulong)uVar11 + 1] = sVar33 + uVar5;
        if (uVar21 < 0x1000000) {
          uVar21 = uVar21 << 8;
          bVar23 = *pbVar30;
          pbVar30 = pbVar30 + 1;
          uVar10 = uVar10 << 8 | (uint)bVar23;
        }
        uVar5 = puVar18[(ulong)uVar11 + lVar31];
        uVar28 = (uVar21 >> 0xb) * (uint)uVar5;
        uVar25 = (int)lVar31 * 2;
        uVar24 = uVar10 - uVar28;
        if (uVar10 < uVar28) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar24 = uVar10;
        }
        else {
          uVar28 = uVar21 - uVar28;
          sVar33 = -(uVar5 >> 5);
          uVar25 = uVar25 | 1;
        }
        puVar18[(ulong)uVar11 + lVar31] = sVar33 + uVar5;
        uVar5 = puVar18[(ulong)uVar11 + (ulong)uVar25];
        if (uVar28 < 0x1000000) {
          uVar28 = uVar28 << 8;
          bVar23 = *pbVar30;
          pbVar30 = pbVar30 + 1;
          uVar24 = uVar24 << 8 | (uint)bVar23;
        }
        uVar22 = (uVar28 >> 0xb) * (uint)uVar5;
        uVar21 = uVar25 * 2;
        uVar10 = uVar24 - uVar22;
        if (uVar24 < uVar22) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar10 = uVar24;
        }
        else {
          uVar22 = uVar28 - uVar22;
          sVar33 = -(uVar5 >> 5);
          uVar21 = uVar21 | 1;
        }
        puVar18[(ulong)uVar11 + (ulong)uVar25] = sVar33 + uVar5;
        uVar21 = uVar21 - 8;
      }
      else {
        uVar28 = uVar28 - uVar22;
        *puVar18 = uVar5 - (uVar5 >> 5);
        if (uVar28 < 0x1000000) {
          uVar28 = uVar28 * 0x100;
          bVar23 = *pbVar30;
          pbVar30 = pbVar30 + 1;
          uVar21 = uVar21 * 0x100 | (uint)bVar23;
        }
        uVar5 = puVar18[8];
        uVar22 = (uVar28 >> 0xb) * (uint)uVar5;
        uVar10 = uVar21 - uVar22;
        if (uVar21 < uVar22) {
          puVar18[8] = (short)(0x800 - uVar5 >> 5) + uVar5;
          if (uVar22 < 0x1000000) {
            uVar22 = uVar22 * 0x100;
            bVar23 = *pbVar30;
            pbVar30 = pbVar30 + 1;
            uVar21 = uVar21 << 8 | (uint)bVar23;
          }
          uVar5 = puVar18[(ulong)uVar11 + 9];
          uVar25 = (uVar22 >> 0xb) * (uint)uVar5;
          uVar10 = uVar21 - uVar25;
          if (uVar21 < uVar25) {
            sVar33 = (short)(0x800 - uVar5 >> 5);
            uVar22 = 2;
            uVar10 = uVar21;
          }
          else {
            uVar25 = uVar22 - uVar25;
            sVar33 = -(uVar5 >> 5);
            uVar22 = 3;
          }
          puVar18[(ulong)uVar11 + 9] = sVar33 + uVar5;
          if (uVar25 < 0x1000000) {
            uVar25 = uVar25 << 8;
            bVar23 = *pbVar30;
            pbVar30 = pbVar30 + 1;
            uVar10 = uVar10 << 8 | (uint)bVar23;
          }
          uVar5 = puVar18[(ulong)uVar11 + (ulong)uVar22 + 8];
          uVar28 = (uVar25 >> 0xb) * (uint)uVar5;
          uVar21 = uVar22 * 2;
          uVar24 = uVar10 - uVar28;
          if (uVar10 < uVar28) {
            sVar33 = (short)(0x800 - uVar5 >> 5);
            uVar24 = uVar10;
          }
          else {
            uVar28 = uVar25 - uVar28;
            sVar33 = -(uVar5 >> 5);
            uVar21 = uVar21 | 1;
          }
          puVar18[(ulong)uVar11 + (ulong)uVar22 + 8] = sVar33 + uVar5;
          uVar35 = (ulong)uVar21;
          uVar5 = puVar18[(ulong)uVar11 + uVar35 + 8];
          if (uVar28 < 0x1000000) {
            uVar28 = uVar28 << 8;
            bVar23 = *pbVar30;
            pbVar30 = pbVar30 + 1;
            uVar24 = (uint)bVar23 | uVar24 << 8;
          }
          uVar22 = (uVar28 >> 0xb) * (uint)uVar5;
          uVar21 = uVar21 * 2;
          uVar10 = uVar24 - uVar22;
          if (uVar24 < uVar22) {
            puVar18[(ulong)uVar11 + uVar35 + 8] = (short)(0x800 - uVar5 >> 5) + uVar5;
            uVar10 = uVar24;
          }
          else {
            uVar22 = uVar28 - uVar22;
            puVar18[(ulong)uVar11 + uVar35 + 8] = uVar5 - (uVar5 >> 5);
            uVar21 = uVar21 | 1;
          }
        }
        else {
          uVar22 = uVar28 - uVar22;
          puVar18[8] = uVar5 - (uVar5 >> 5);
          uVar35 = 1;
          do {
            uVar25 = uVar22;
            uVar24 = uVar10;
            if (uVar22 < 0x1000000) {
              uVar25 = uVar22 << 8;
              bVar23 = *pbVar30;
              pbVar30 = pbVar30 + 1;
              uVar24 = uVar10 << 8 | (uint)bVar23;
            }
            uVar5 = puVar18[uVar35 + 0x100];
            uVar22 = (uVar25 >> 0xb) * (uint)uVar5;
            uVar21 = (int)uVar35 * 2;
            uVar10 = uVar24 - uVar22;
            if (uVar24 < uVar22) {
              sVar33 = (short)(0x800 - uVar5 >> 5);
              uVar10 = uVar24;
            }
            else {
              uVar22 = uVar25 - uVar22;
              sVar33 = -(uVar5 >> 5);
              uVar21 = uVar21 | 1;
            }
            puVar18[uVar35 + 0x100] = sVar33 + uVar5;
            uVar35 = (ulong)uVar21;
          } while (uVar21 < 0x100);
          uVar21 = uVar21 - 0xf0;
        }
      }
      uVar25 = local_c0;
      uVar24 = local_c4;
      uVar11 = local_bc;
      if (0xb < UVar32) {
        uVar24 = 3;
        if (uVar21 < 3) {
          uVar24 = uVar21;
        }
        if (uVar22 < 0x1000000) {
          uVar22 = uVar22 << 8;
          bVar23 = *pbVar30;
          pbVar30 = pbVar30 + 1;
          uVar10 = (uint)bVar23 | uVar10 << 8;
        }
        uVar35 = (ulong)(uVar24 << 7);
        uVar5 = *(ushort *)((long)pCVar7 + uVar35 + 0x82);
        uVar11 = (uVar22 >> 0xb) * (uint)uVar5;
        uVar24 = uVar10 - uVar11;
        if (uVar10 < uVar11) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar22 = 2;
          uVar24 = uVar10;
        }
        else {
          uVar11 = uVar22 - uVar11;
          sVar33 = -(uVar5 >> 5);
          uVar22 = 3;
        }
        lVar31 = uVar35 + 0x80;
        *(ushort *)((long)pCVar7 + uVar35 + 0x82) = sVar33 + uVar5;
        if (uVar11 < 0x1000000) {
          uVar11 = uVar11 << 8;
          bVar23 = *pbVar30;
          pbVar30 = pbVar30 + 1;
          uVar24 = (uint)bVar23 | uVar24 << 8;
        }
        uVar5 = *(ushort *)((long)pCVar7 + (ulong)uVar22 * 2 + lVar31);
        uVar17 = (uVar11 >> 0xb) * (uint)uVar5;
        uVar10 = uVar22 * 2;
        uVar28 = uVar24 - uVar17;
        if (uVar24 < uVar17) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar28 = uVar24;
        }
        else {
          uVar17 = uVar11 - uVar17;
          sVar33 = -(uVar5 >> 5);
          uVar10 = uVar10 | 1;
        }
        *(ushort *)((long)pCVar7 + (ulong)uVar22 * 2 + lVar31) = sVar33 + uVar5;
        uVar5 = *(ushort *)((long)pCVar7 + (ulong)uVar10 * 2 + lVar31);
        if (uVar17 < 0x1000000) {
          uVar17 = uVar17 << 8;
          bVar23 = *pbVar30;
          pbVar30 = pbVar30 + 1;
          uVar28 = (uint)bVar23 | uVar28 << 8;
        }
        uVar11 = (uVar17 >> 0xb) * (uint)uVar5;
        uVar22 = uVar10 * 2;
        uVar24 = uVar28 - uVar11;
        if (uVar28 < uVar11) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar24 = uVar28;
        }
        else {
          uVar11 = uVar17 - uVar11;
          sVar33 = -(uVar5 >> 5);
          uVar22 = uVar22 | 1;
        }
        *(ushort *)((long)pCVar7 + (ulong)uVar10 * 2 + lVar31) = sVar33 + uVar5;
        uVar5 = *(ushort *)((long)pCVar7 + (ulong)uVar22 * 2 + lVar31);
        if (uVar11 < 0x1000000) {
          uVar11 = uVar11 << 8;
          bVar23 = *pbVar30;
          pbVar30 = pbVar30 + 1;
          uVar24 = (uint)bVar23 | uVar24 << 8;
        }
        uVar17 = (uVar11 >> 0xb) * (uint)uVar5;
        uVar10 = uVar22 * 2;
        uVar28 = uVar24 - uVar17;
        if (uVar24 < uVar17) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar28 = uVar24;
        }
        else {
          uVar17 = uVar11 - uVar17;
          sVar33 = -(uVar5 >> 5);
          uVar10 = uVar10 | 1;
        }
        *(ushort *)((long)pCVar7 + (ulong)uVar22 * 2 + lVar31) = sVar33 + uVar5;
        uVar5 = *(ushort *)((long)pCVar7 + (ulong)uVar10 * 2 + lVar31);
        if (uVar17 < 0x1000000) {
          uVar17 = uVar17 << 8;
          bVar23 = *pbVar30;
          pbVar30 = pbVar30 + 1;
          uVar28 = (uint)bVar23 | uVar28 << 8;
        }
        uVar20 = (uVar17 >> 0xb) * (uint)uVar5;
        uVar24 = uVar10 * 2;
        uVar11 = uVar28 - uVar20;
        if (uVar28 < uVar20) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar11 = uVar28;
        }
        else {
          uVar20 = uVar17 - uVar20;
          sVar33 = -(uVar5 >> 5);
          uVar24 = uVar24 | 1;
        }
        *(ushort *)((long)pCVar7 + (ulong)uVar10 * 2 + lVar31) = sVar33 + uVar5;
        uVar5 = *(ushort *)((long)pCVar7 + (ulong)uVar24 * 2 + lVar31);
        if (uVar20 < 0x1000000) {
          uVar20 = uVar20 << 8;
          bVar23 = *pbVar30;
          pbVar30 = pbVar30 + 1;
          uVar11 = (uint)bVar23 | uVar11 << 8;
        }
        uVar22 = (uVar20 >> 0xb) * (uint)uVar5;
        uVar28 = uVar24 * 2;
        uVar10 = uVar11 - uVar22;
        if (uVar11 < uVar22) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar10 = uVar11;
        }
        else {
          uVar22 = uVar20 - uVar22;
          sVar33 = -(uVar5 >> 5);
          uVar28 = uVar28 | 1;
        }
        *(ushort *)((long)pCVar7 + (ulong)uVar24 * 2 + lVar31) = sVar33 + uVar5;
        uVar17 = uVar28 - 0x40;
        uVar35 = SVar34;
        if (3 < uVar17) {
          uVar24 = uVar28 & 1 | 2;
          if (uVar17 < 0xe) {
            iVar12 = (uVar17 >> 1) - 1;
            uVar17 = (uVar24 << ((byte)iVar12 & 0x1f)) + 1;
            iVar13 = 1;
            do {
              iVar26 = iVar13;
              uVar25 = uVar22;
              if (uVar22 < 0x1000000) {
                uVar25 = uVar22 << 8;
                bVar23 = *pbVar30;
                pbVar30 = pbVar30 + 1;
                uVar10 = uVar10 << 8 | (uint)bVar23;
              }
              uVar5 = pCVar7[(ulong)uVar17 - 0x680];
              uVar22 = (uVar25 >> 0xb) * (uint)uVar5;
              uVar24 = uVar10 - uVar22;
              if (uVar10 < uVar22) {
                sVar33 = (short)(0x800 - uVar5 >> 5);
                iVar13 = iVar26;
              }
              else {
                uVar22 = uVar25 - uVar22;
                sVar33 = -(uVar5 >> 5);
                uVar10 = uVar24;
                iVar13 = iVar26 * 2;
              }
              pCVar7[(ulong)uVar17 - 0x680] = sVar33 + uVar5;
              uVar17 = uVar17 + iVar13;
              iVar12 = iVar12 + -1;
              iVar13 = iVar26 * 2;
            } while (iVar12 != 0);
            uVar17 = uVar17 + iVar26 * -2;
          }
          else {
            iVar13 = (uVar17 >> 1) - 5;
            do {
              uVar11 = uVar22;
              if (uVar22 < 0x1000000) {
                bVar23 = *pbVar30;
                pbVar30 = pbVar30 + 1;
                uVar10 = (uint)bVar23 | uVar10 << 8;
                uVar11 = uVar22 << 8;
              }
              uVar22 = uVar11 >> 1;
              uVar28 = (int)(uVar10 - uVar22) >> 0x1f;
              uVar24 = uVar28 + uVar24 * 2 + 1;
              uVar10 = (uVar28 & uVar22) + (uVar10 - uVar22);
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
            if (uVar11 < 0x2000000) {
              uVar22 = uVar22 << 8;
              bVar23 = *pbVar30;
              pbVar30 = pbVar30 + 1;
              uVar10 = (uint)bVar23 | uVar10 * 0x100;
            }
            uVar5 = pCVar7[1];
            uVar28 = (uVar22 >> 0xb) * (uint)uVar5;
            uVar11 = uVar10 - uVar28;
            if (uVar10 < uVar28) {
              sVar33 = (short)(0x800 - uVar5 >> 5);
              uVar22 = 2;
              uVar11 = uVar10;
            }
            else {
              uVar28 = uVar22 - uVar28;
              sVar33 = -(uVar5 >> 5);
              uVar22 = 3;
            }
            pCVar7[1] = sVar33 + uVar5;
            if (uVar28 < 0x1000000) {
              uVar28 = uVar28 << 8;
              bVar23 = *pbVar30;
              pbVar30 = pbVar30 + 1;
              uVar11 = (uint)bVar23 | uVar11 << 8;
            }
            uVar5 = pCVar7[uVar22];
            uVar17 = (uVar28 >> 0xb) * (uint)uVar5;
            uVar10 = uVar11 - uVar17;
            if (uVar11 < uVar17) {
              sVar33 = (short)(0x800 - uVar5 >> 5);
              uVar28 = uVar22 + 2;
              uVar10 = uVar11;
            }
            else {
              uVar17 = uVar28 - uVar17;
              sVar33 = -(uVar5 >> 5);
              uVar28 = uVar22 + 4;
            }
            pCVar7[uVar22] = sVar33 + uVar5;
            uVar5 = pCVar7[uVar28];
            if (uVar17 < 0x1000000) {
              uVar17 = uVar17 << 8;
              bVar23 = *pbVar30;
              pbVar30 = pbVar30 + 1;
              uVar10 = (uint)bVar23 | uVar10 << 8;
            }
            uVar20 = (uVar17 >> 0xb) * (uint)uVar5;
            uVar11 = uVar10 - uVar20;
            if (uVar10 < uVar20) {
              sVar33 = (short)(0x800 - uVar5 >> 5);
              iVar13 = 4;
              uVar11 = uVar10;
            }
            else {
              uVar20 = uVar17 - uVar20;
              sVar33 = -(uVar5 >> 5);
              iVar13 = 8;
            }
            uVar29 = uVar28 + iVar13;
            pCVar7[uVar28] = sVar33 + uVar5;
            uVar5 = pCVar7[uVar29];
            if (uVar20 < 0x1000000) {
              uVar20 = uVar20 << 8;
              bVar23 = *pbVar30;
              pbVar30 = pbVar30 + 1;
              uVar11 = (uint)bVar23 | uVar11 << 8;
            }
            uVar22 = (uVar20 >> 0xb) * (uint)uVar5;
            uVar10 = uVar11 - uVar22;
            if (uVar11 < uVar22) {
              sVar33 = (short)(0x800 - uVar5 >> 5);
              uVar10 = uVar11;
              uVar17 = uVar29 - 8;
            }
            else {
              uVar22 = uVar20 - uVar22;
              sVar33 = -(uVar5 >> 5);
              uVar17 = uVar29;
            }
            uVar17 = uVar24 * 0x10 | uVar17;
            pCVar7[uVar29] = sVar33 + uVar5;
            if (uVar17 == 0xffffffff) {
              UVar32 = UVar32 - 0xc;
              uVar21 = 0x112;
LAB_00199203:
              local_c0 = uVar25;
              if (uVar22 < 0x1000000) {
                uVar22 = uVar22 << 8;
                bVar1 = *pbVar30;
                pbVar30 = pbVar30 + 1;
                uVar10 = (uint)bVar1 | uVar10 << 8;
              }
              p->buf = pbVar30;
              p->range = uVar22;
              p->code = uVar10;
              p->remainLen = uVar21;
              p->dicPos = uVar35;
              p->processedPos = UVar36;
              p->reps[0] = local_c0;
              p->reps[1] = local_bc;
              p->reps[2] = local_c4;
              p->reps[3] = local_94;
              p->state = UVar32;
              if ((p->checkDicSize == 0) && (uVar6 = (p->prop).dicSize, uVar6 <= UVar36)) {
                p->checkDicSize = uVar6;
              }
              return (uint)(0x1ff < uVar21);
            }
          }
        }
        uVar25 = uVar17 + 1;
        UVar32 = (uint)(0x12 < UVar32) * 3 + 7;
        uVar28 = uVar6;
        if (uVar6 == 0) {
          uVar28 = UVar36;
        }
        uVar24 = local_bc;
        uVar11 = local_c0;
        local_94 = local_c4;
        if (uVar28 <= uVar17) {
          uVar21 = uVar21 + 0x202;
          local_c4 = local_bc;
          local_bc = local_c0;
          goto LAB_00199203;
        }
      }
      local_bc = uVar11;
      local_c4 = uVar24;
      uVar21 = uVar21 + 2;
      uVar16 = local_80 - SVar34;
      uVar35 = local_80;
      if (uVar16 == 0) goto LAB_00199203;
      uVar15 = uVar16 & 0xffffffff;
      if (uVar21 <= uVar16) {
        uVar15 = (ulong)uVar21;
      }
      SVar19 = 0;
      if (SVar34 < uVar25) {
        SVar19 = SVar9;
      }
      SVar19 = SVar19 + (SVar34 - uVar25);
      uVar21 = uVar21 - (int)uVar15;
      local_c0 = uVar25;
      if (SVar9 - SVar19 < uVar15) {
        lVar31 = 0;
        do {
          pBVar8[lVar31 + SVar34] = pBVar8[SVar19];
          SVar19 = SVar19 + 1;
          if (SVar19 == SVar9) {
            SVar19 = 0;
          }
          lVar31 = lVar31 + 1;
        } while ((int)uVar15 != (int)lVar31);
        uVar35 = SVar34 + lVar31;
      }
      else {
        pBVar27 = pBVar8 + SVar34;
        uVar35 = uVar15;
        do {
          *pBVar27 = pBVar27[SVar19 - SVar34];
          pBVar27 = pBVar27 + 1;
          uVar35 = uVar35 - 1;
        } while (uVar35 != 0);
        uVar35 = SVar34 + uVar15;
      }
    }
    UVar36 = UVar36 + (int)uVar15;
    uVar25 = local_c0;
    if ((local_80 <= uVar35) || (SVar34 = uVar35, bufLimit <= pbVar30)) goto LAB_00199203;
  } while( true );
}

Assistant:

static int Z7_FASTCALL LzmaDec_DecodeReal2(CLzmaDec *p, SizeT limit, const Byte *bufLimit)
{
  if (p->checkDicSize == 0)
  {
    UInt32 rem = p->prop.dicSize - p->processedPos;
    if (limit - p->dicPos > rem)
      limit = p->dicPos + rem;
  }
  {
    int res = LZMA_DECODE_REAL(p, limit, bufLimit);
    if (p->checkDicSize == 0 && p->processedPos >= p->prop.dicSize)
      p->checkDicSize = p->prop.dicSize;
    return res;
  }
}